

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traits.h
# Opt level: O0

ValueAwaiter
async_simple::coro::detail::
getAwaiter<async_simple::coro::detail::LazyBase<cinatra::part_head_t,false>::ValueAwaiter>
          (ValueAwaiter *awaitable)

{
  ValueAwaiter *in_RSI;
  Handle in_RDI;
  
  LazyBase<cinatra::part_head_t,_false>::ValueAwaiter::ValueAwaiter
            (in_RSI,(ValueAwaiter *)in_RDI.__handle_);
  return (ValueAwaiter)(Handle)in_RDI.__handle_;
}

Assistant:

auto getAwaiter(Awaitable&& awaitable) {
    if constexpr (HasMemberCoAwaitOperator<Awaitable>)
        return std::forward<Awaitable>(awaitable).operator co_await();
    else if constexpr (HasGlobalCoAwaitOperator<Awaitable>)
        return operator co_await(std::forward<Awaitable>(awaitable));
    else
        return std::forward<Awaitable>(awaitable);
}